

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_base_z2_row_access<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
               (void)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  bool bVar1;
  reference witness;
  column_content<typename_Matrix<Base_options_with_row_access<true,_(Column_types)7,_false,_true,_false,_false>_>::Column>
  local_258;
  reference local_228;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *r;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range1;
  allocator<unsigned_int> local_1fd;
  uint i;
  iterator local_1f8;
  size_type local_1f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  allocator<unsigned_int> local_1c9;
  uint local_1c8 [6];
  iterator local_1b0;
  size_type local_1a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1a0;
  allocator<unsigned_int> local_185;
  uint local_184;
  iterator local_180;
  size_type local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  allocator<unsigned_int> local_151;
  uint local_150 [2];
  iterator local_148;
  size_type local_140;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_138;
  allocator<unsigned_int> local_119;
  uint local_118 [8];
  iterator local_f8;
  size_type local_f0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e8;
  allocator<unsigned_int> local_c9;
  uint local_c8 [8];
  iterator local_a8;
  size_type local_a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  undefined1 local_80 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  rows;
  undefined1 local_58 [8];
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  
  build_general_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>
              *)local_58,
             (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)&m.matrix_.colSettings_,5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_80);
  local_c8[0] = 3;
  local_c8[1] = 6;
  local_c8[2] = 9;
  local_c8[3] = 10;
  local_c8[4] = 0xb;
  local_a8 = local_c8;
  local_a0 = 5;
  std::allocator<unsigned_int>::allocator(&local_c9);
  __l_04._M_len = local_a0;
  __l_04._M_array = local_a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_98,__l_04,&local_c9);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_80,&local_98);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_98);
  std::allocator<unsigned_int>::~allocator(&local_c9);
  local_118[0] = 3;
  local_118[1] = 5;
  local_118[2] = 8;
  local_118[3] = 9;
  local_118[4] = 0xb;
  local_f8 = local_118;
  local_f0 = 5;
  std::allocator<unsigned_int>::allocator(&local_119);
  __l_03._M_len = local_f0;
  __l_03._M_array = local_f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_e8,__l_03,&local_119);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_80,&local_e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e8);
  std::allocator<unsigned_int>::~allocator(&local_119);
  local_150[0] = 5;
  local_150[1] = 8;
  local_148 = local_150;
  local_140 = 2;
  std::allocator<unsigned_int>::allocator(&local_151);
  __l_02._M_len = local_140;
  __l_02._M_array = local_148;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_138,__l_02,&local_151);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_80,&local_138);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_138);
  std::allocator<unsigned_int>::~allocator(&local_151);
  local_184 = 7;
  local_180 = &local_184;
  local_178 = 1;
  std::allocator<unsigned_int>::allocator(&local_185);
  __l_01._M_len = local_178;
  __l_01._M_array = local_180;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_170,__l_01,&local_185);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_80,&local_170);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_170);
  std::allocator<unsigned_int>::~allocator(&local_185);
  local_1c8[4] = 10;
  local_1c8[5] = 0xb;
  local_1c8[0] = 3;
  local_1c8[1] = 6;
  local_1c8[2] = 7;
  local_1c8[3] = 9;
  local_1b0 = local_1c8;
  local_1a8 = 6;
  std::allocator<unsigned_int>::allocator(&local_1c9);
  __l_00._M_len = local_1a8;
  __l_00._M_array = local_1b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1a0,__l_00,&local_1c9);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_80,&local_1a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1a0);
  std::allocator<unsigned_int>::~allocator(&local_1c9);
  i = 7;
  local_1f8 = &i;
  local_1f0 = 1;
  std::allocator<unsigned_int>::allocator(&local_1fd);
  __l._M_len = local_1f0;
  __l._M_array = local_1f8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_1e8,__l,&local_1fd);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_80,&local_1e8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1e8);
  std::allocator<unsigned_int>::~allocator(&local_1fd);
  __range1._4_4_ = 0;
  __end1 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)local_80);
  r = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::end((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_80);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&r);
    if (!bVar1) break;
    witness = __gnu_cxx::
              __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator*(&__end1);
    local_228 = witness;
    get_ordered_row<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>
              (&local_258,
               (Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
                *)local_58,__range1._4_4_);
    test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,false>>>>
              (witness,&local_258);
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_258)
    ;
    __gnu_cxx::
    __normal_iterator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end1);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_80);
  Gudhi::persistence_matrix::
  Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
  ::~Matrix((Matrix<Base_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_false>_>
             *)local_58);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_base_z2_row_access() {
  auto columns = build_general_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  std::vector<std::vector<unsigned int> > rows;
  if constexpr (Matrix::Option_list::has_column_compression) {
    // if the union find structure changes, the column_index values of the entries could also change. Change the test
    // with all possibilities?
    rows.push_back({3, 6});
    rows.push_back({3, 5});
    rows.push_back({5});
    rows.push_back({7});
    rows.push_back({3, 6, 7});
    rows.push_back({7});
  } else {
    rows.push_back({3, 6, 9, 10, 11});
    rows.push_back({3, 5, 8, 9, 11});
    rows.push_back({5, 8});
    rows.push_back({7});
    rows.push_back({3, 6, 7, 9, 10, 11});
    rows.push_back({7});
  }

  unsigned int i = 0;
  for (auto& r : rows) {
    test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
  }
}